

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallt_class(void *cls,char *name,metacall_value_id ret,void **args,size_t size)

{
  type_id *args_00;
  method m;
  value pvVar1;
  
  args_00 = metacall_type_ids(args,size);
  m = class_static_method((klass)cls,name,ret,args_00,size);
  if (args_00 != (type_id *)0x0) {
    free(args_00);
  }
  if (m != (method)0x0) {
    pvVar1 = class_static_call((klass)cls,m,args,size);
    return pvVar1;
  }
  log_write_impl_va("metacall",0x8b2,"metacallt_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                    ,LOG_LEVEL_ERROR,
                    "Method %s in class <%p> is not implemented with the parameter types being received"
                    ,name,cls);
  return (void *)0x0;
}

Assistant:

void *metacallt_class(void *cls, const char *name, const enum metacall_value_id ret, void *args[], size_t size)
{
	type_id *ids = metacall_type_ids(args, size);

	method m = class_static_method(cls, name, ret, ids, size);

	if (ids != NULL)
	{
		free(ids);
	}

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Method %s in class <%p> is not implemented with the parameter types being received", name, cls);
		return NULL;
	}

	return class_static_call(cls, m, args, size);
}